

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

UBool __thiscall icu_63::NFRule::allIgnorable(NFRule *this,UnicodeString *str,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  undefined4 extraout_var;
  CollationElementIterator *pCVar4;
  bool bVar5;
  int local_50;
  UErrorCode local_4c;
  int32_t o;
  UErrorCode err;
  LocalPointerBase<icu_63::CollationElementIterator> local_38;
  LocalPointer<icu_63::CollationElementIterator> iter;
  RuleBasedCollator *collator;
  UErrorCode *status_local;
  UnicodeString *str_local;
  NFRule *this_local;
  
  iVar2 = UnicodeString::length(str);
  if (iVar2 == 0) {
    this_local._7_1_ = true;
  }
  else {
    iVar3 = (*(this->formatter->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x19])
                      ();
    if ((char)iVar3 == '\0') {
      this_local._7_1_ = false;
    }
    else {
      iter.super_LocalPointerBase<icu_63::CollationElementIterator>.ptr =
           (LocalPointerBase<icu_63::CollationElementIterator>)
           RuleBasedNumberFormat::getCollator(this->formatter);
      if (iter.super_LocalPointerBase<icu_63::CollationElementIterator>.ptr ==
          (CollationElementIterator *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        this_local._7_1_ = false;
      }
      else {
        iVar3 = (*((UObject *)
                  &(((CollationElementIterator *)
                    iter.super_LocalPointerBase<icu_63::CollationElementIterator>.ptr)->
                   super_UObject)._vptr_UObject)->_vptr_UObject[0x27])
                          (iter.super_LocalPointerBase<icu_63::CollationElementIterator>.ptr,str);
        LocalPointer<icu_63::CollationElementIterator>::LocalPointer
                  ((LocalPointer<icu_63::CollationElementIterator> *)&local_38,
                   (CollationElementIterator *)CONCAT44(extraout_var,iVar3));
        UVar1 = LocalPointerBase<icu_63::CollationElementIterator>::isNull(&local_38);
        if (UVar1 == '\0') {
          local_4c = U_ZERO_ERROR;
          pCVar4 = LocalPointerBase<icu_63::CollationElementIterator>::operator->(&local_38);
          local_50 = CollationElementIterator::next(pCVar4,&local_4c);
          while( true ) {
            bVar5 = false;
            if (local_50 != -1) {
              iVar2 = CollationElementIterator::primaryOrder(local_50);
              bVar5 = iVar2 == 0;
            }
            if (!bVar5) break;
            pCVar4 = LocalPointerBase<icu_63::CollationElementIterator>::operator->(&local_38);
            local_50 = CollationElementIterator::next(pCVar4,&local_4c);
          }
          this_local._7_1_ = local_50 == -1;
        }
        else {
          *status = U_MEMORY_ALLOCATION_ERROR;
          this_local._7_1_ = false;
        }
        o = 1;
        LocalPointer<icu_63::CollationElementIterator>::~LocalPointer
                  ((LocalPointer<icu_63::CollationElementIterator> *)&local_38);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
NFRule::allIgnorable(const UnicodeString& str, UErrorCode& status) const
{
    // if the string is empty, we can just return true
    if (str.length() == 0) {
        return TRUE;
    }

#if !UCONFIG_NO_COLLATION
    // if lenient parsing is turned on, walk through the string with
    // a collation element iterator and make sure each collation
    // element is 0 (ignorable) at the primary level
    if (formatter->isLenient()) {
        const RuleBasedCollator* collator = formatter->getCollator();
        if (collator == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return FALSE;
        }
        LocalPointer<CollationElementIterator> iter(collator->createCollationElementIterator(str));

        // Memory allocation error check.
        if (iter.isNull()) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return FALSE;
        }

        UErrorCode err = U_ZERO_ERROR;
        int32_t o = iter->next(err);
        while (o != CollationElementIterator::NULLORDER
            && CollationElementIterator::primaryOrder(o) == 0) {
            o = iter->next(err);
        }

        return o == CollationElementIterator::NULLORDER;
    }
#endif

    // if lenient parsing is turned off, there is no such thing as
    // an ignorable character: return true only if the string is empty
    return FALSE;
}